

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

size_t __thiscall leveldb::anon_unknown_0::ShardedLRUCache::TotalCharge(ShardedLRUCache *this)

{
  long lVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  int s;
  size_t total;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  undefined8 local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0;
  for (iVar3 = 0; iVar3 < 0x10; iVar3 = iVar3 + 1) {
    sVar2 = LRUCache::TotalCharge((LRUCache *)CONCAT44(iVar3,in_stack_ffffffffffffffe0));
    local_18 = sVar2 + local_18;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

size_t TotalCharge() const override {
    size_t total = 0;
    for (int s = 0; s < kNumShards; s++) {
      total += shard_[s].TotalCharge();
    }
    return total;
  }